

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

void __thiscall Buffer::Free(Buffer *this,int BlockNum)

{
  size_t *psVar1;
  int iVar2;
  _List_node_base *p_Var3;
  
  p_Var3 = (_List_node_base *)&this->Occupy_Block;
  do {
    p_Var3 = (((_List_base<int,_std::allocator<int>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)&this->Occupy_Block) {
      return;
    }
  } while (*(int *)&p_Var3[1]._M_next != BlockNum);
  iVar2 = *(int *)&p_Var3[1]._M_next;
  psVar1 = &(this->Occupy_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size
  ;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var3,0x18);
  p_Var3 = (_List_node_base *)operator_new(0x18);
  *(int *)&p_Var3[1]._M_next = iVar2;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->Empty_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  memset(this->buffer[iVar2].data,0,0x2000);
  Block::WriteFile(this->buffer + iVar2);
  std::__cxx11::string::_M_replace
            ((ulong)(this->buffer + iVar2),0,(char *)this->buffer[iVar2].FileName._M_string_length,
             0x1493a5);
  this->buffer[iVar2].FileOff = -1;
  this->Dirty[iVar2] = 0;
  this->Pin[iVar2] = 0;
  return;
}

Assistant:

void Buffer::Free(int BlockNum) {
	int pos;
	list<int>::iterator it;
	it = this->Find(BlockNum);
	if (it != this->Occupy_Block.end()) {			//B�ڱ�ռ��������
		pos = *it;
		it = this->Occupy_Block.erase(it);			//��ռ�ÿ�������ɾȥ
		this->Empty_Block.push_back(pos);			//��ӽ��տ�������
		this->buffer[pos].BlockClear_Back();
		this->UnDirt(pos);
		this->UnLock(pos);
	}
}